

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::Scanner::scanToNextToken(Scanner *this)

{
  char *pcVar1;
  char *pcVar2;
  
  while( true ) {
    while ((*this->Current == ' ' || (*this->Current == '\t'))) {
      skip(this,1);
    }
    skipComment(this);
    pcVar1 = this->Current;
    pcVar2 = pcVar1;
    if (this->End != pcVar1) {
      if (*pcVar1 == '\n') {
        pcVar2 = pcVar1 + 1;
      }
      else if (((*pcVar1 == '\r') && (pcVar2 = pcVar1 + 1, pcVar2 != this->End)) &&
              (pcVar1[1] == '\n')) {
        pcVar2 = pcVar1 + 2;
      }
    }
    if (pcVar2 == pcVar1) break;
    this->Current = pcVar2;
    this->Line = this->Line + 1;
    this->Column = 0;
    if (this->FlowLevel == 0) {
      this->IsSimpleKeyAllowed = true;
    }
    if (pcVar2 == pcVar1) {
      return;
    }
  }
  return;
}

Assistant:

void Scanner::scanToNextToken() {
  while (true) {
    while (*Current == ' ' || *Current == '\t') {
      skip(1);
    }

    skipComment();

    // Skip EOL.
    StringRef::iterator i = skip_b_break(Current);
    if (i == Current)
      break;
    Current = i;
    ++Line;
    Column = 0;
    // New lines may start a simple key.
    if (!FlowLevel)
      IsSimpleKeyAllowed = true;
  }
}